

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O1

void __thiscall
despot::TagBlindBeliefPolicy::TagBlindBeliefPolicy(TagBlindBeliefPolicy *this,BaseTag *model)

{
  DSPOMDP *pDVar1;
  
  pDVar1 = (DSPOMDP *)&model->super_BeliefMDP;
  if (model == (BaseTag *)0x0) {
    pDVar1 = (DSPOMDP *)0x0;
  }
  despot::BeliefLowerBound::BeliefLowerBound(&this->super_BeliefLowerBound,pDVar1);
  *(undefined ***)this = &PTR__TagBlindBeliefPolicy_0011f938;
  (this->alpha_vectors_).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->alpha_vectors_).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->alpha_vectors_).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->tag_model_ = model;
  (**(code **)(*(long *)model + 0x38))(model);
  return;
}

Assistant:

TagBlindBeliefPolicy(const BaseTag* model) :
		BeliefLowerBound(model),
		tag_model_(model) {
		const_cast<BaseTag*>(tag_model_)->ComputeBlindAlpha();
	}